

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_mf_cc.hpp
# Opt level: O0

bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>
* boost::
  bind<void,boost::unit_test::test_unit_fixture,boost::shared_ptr<boost::unit_test::test_unit_fixture>>
            (F f,shared_ptr<boost::unit_test::test_unit_fixture> *a1)

{
  mf0<void,_boost::unit_test::test_unit_fixture> f_00;
  undefined8 in_RCX;
  F in_RSI;
  bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>
  *in_RDI;
  shared_ptr<boost::unit_test::test_unit_fixture> *in_stack_ffffffffffffff58;
  bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>
  *pbVar1;
  value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_> *in_stack_ffffffffffffff88;
  list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>
  *in_stack_ffffffffffffff90;
  mf0<void,_boost::unit_test::test_unit_fixture> local_40 [4];
  
  pbVar1 = in_RDI;
  _mfi::mf0<void,_boost::unit_test::test_unit_fixture>::mf0(local_40,in_RSI);
  _bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>::value
            ((value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_> *)in_RDI,
             in_stack_ffffffffffffff58);
  _bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>::list1
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  f_00._8_8_ = in_RCX;
  f_00.f_ = (F)pbVar1;
  _bi::
  bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>
  ::bind_t(in_RDI,f_00,
           (list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_> *)
           in_stack_ffffffffffffff58);
  _bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>::~list1
            ((list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_> *)
             0x25976e);
  _bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>::~value
            ((value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_> *)0x259778);
  return pbVar1;
}

Assistant:

_bi::bind_t<R, _mfi::BOOST_BIND_MF_NAME(mf0)<R, T>, typename _bi::list_av_1<A1>::type>
    BOOST_BIND(R (BOOST_BIND_MF_CC T::*f) () BOOST_BIND_MF_NOEXCEPT, A1 a1)
{
    typedef _mfi::BOOST_BIND_MF_NAME(mf0)<R, T> F;
    typedef typename _bi::list_av_1<A1>::type list_type;
    return _bi::bind_t<R, F, list_type>(F(f), list_type(a1));
}